

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O2

void AArch64_init(MCRegisterInfo *MRI)

{
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  undefined4 in_stack_ffffffffffffffec;
  uint16_t *in_stack_fffffffffffffff8;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,AArch64RegDesc,0x1a4,0,0,AArch64MCRegisterClasses,0x2d2510,(uint16_t (*) [2])0x0,
             0x2d2a00,(MCPhysReg *)CONCAT44(in_stack_ffffffffffffffec,0x35),(char *)0x0,
             in_stack_fffffffffffffff8,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void AArch64_init(MCRegisterInfo *MRI)
{
	/*
		InitMCRegisterInfo(AArch64RegDesc, 420,
			RA, PC,
			AArch64MCRegisterClasses, 43,
			AArch64RegUnitRoots, 66, AArch64RegDiffLists,
			AArch64RegStrings,
			AArch64SubRegIdxLists, 53,
			AArch64SubRegIdxRanges,
			AArch64RegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, AArch64RegDesc, 420,
			0, 0, 
			AArch64MCRegisterClasses, 43,
			0, 0, AArch64RegDiffLists,
			0, 
			AArch64SubRegIdxLists, 53,
			0);
}